

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-msg.c
# Opt level: O0

wchar_t message_flags(monster *mon)

{
  _Bool _Var1;
  wchar_t local_14;
  wchar_t flags;
  monster *mon_local;
  
  _Var1 = panel_contains((mon->grid).y,(mon->grid).x);
  local_14 = (wchar_t)!_Var1;
  _Var1 = monster_is_obvious(mon);
  if (!_Var1) {
    local_14 = local_14 | 2;
  }
  return local_14;
}

Assistant:

static int message_flags(const struct monster *mon)
{
	int flags = 0;

	if (!panel_contains(mon->grid.y, mon->grid.x)) {
		flags |= MON_MSG_FLAG_OFFSCREEN;
	}

	if (!monster_is_obvious(mon)) {
		flags |= MON_MSG_FLAG_INVISIBLE;
	}

	return flags;
}